

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

void __thiscall
QtMWidgets::NavigationBarPrivate::removeWidget(NavigationBarPrivate *this,QWidget *w)

{
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar1;
  qsizetype i;
  QVector<QSharedPointer<NavigationItem>_> *vector;
  long lVar2;
  long lVar3;
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QVector<QSharedPointer<NavigationItem>_> tmp;
  QSharedPointer<QtMWidgets::NavigationItem> local_50;
  QWidget *local_40;
  QArrayDataPointer<QSharedPointer<QtMWidgets::NavigationItem>_> local_38;
  
  local_40 = w;
  pQVar1 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&this->itemsMap,&local_40);
  local_50.value = pQVar1->value;
  local_50.d = pQVar1->d;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->weakref)._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    ((local_50.d)->strongref)._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::remove
            (&this->itemsMap,(char *)&local_40);
  QStackedWidget::removeWidget((QWidget *)this->stack);
  local_38.d = ((local_50.value)->children).d.d;
  pQVar1 = ((local_50.value)->children).d.ptr;
  local_38.size = ((local_50.value)->children).d.size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar3 = local_38.size * 0x10;
  local_38.ptr = pQVar1;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 0x10) {
    removeWidget(this,*(QWidget **)(*(long *)((long)&pQVar1->value + lVar2) + 0x18));
  }
  if ((local_50.value)->parent != (NavigationItem *)0x0) {
    vector = &(local_50.value)->parent->children;
    i = QtPrivate::
        indexOf<QSharedPointer<QtMWidgets::NavigationItem>,QSharedPointer<QtMWidgets::NavigationItem>>
                  (vector,&local_50,0);
    QList<QSharedPointer<QtMWidgets::NavigationItem>_>::removeAt(vector,i);
  }
  QArrayDataPointer<QSharedPointer<QtMWidgets::NavigationItem>_>::~QArrayDataPointer(&local_38);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(local_50.d);
  return;
}

Assistant:

void
NavigationBarPrivate::removeWidget( QWidget * w )
{
	QSharedPointer< NavigationItem > item = itemsMap[ w ];

	itemsMap.remove( w );
	stack->removeWidget( w );

	const auto tmp = item->children;

	for( const auto & c : tmp )
		removeWidget( c->self );

	if( item->parent )
		item->parent->children.removeAt(
			item->parent->children.indexOf( item ) );
}